

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

inform_dist * inform_dist_copy(inform_dist *src,inform_dist *dest)

{
  size_t n;
  
  if (src != (inform_dist *)0x0) {
    n = src->size;
    if (dest == (inform_dist *)0x0) {
      if (n == 0) {
        return (inform_dist *)0x0;
      }
      dest = inform_dist_alloc(n);
    }
    else {
      if (n == dest->size) {
        if (src == dest) {
          return dest;
        }
        goto LAB_00157e4d;
      }
      dest = inform_dist_realloc(dest,n);
    }
    if (dest != (inform_dist *)0x0) {
      n = src->size;
LAB_00157e4d:
      memcpy(dest->histogram,src->histogram,n << 2);
      dest->counts = src->counts;
      return dest;
    }
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_copy(inform_dist const *src, inform_dist *dest)
{
    // if the source is NULL, return NULL.
    if (src == NULL)
    {
        return NULL;
    }
    // if the destination is NULL or the destination size is not the same
    // as the source
    else if (dest == NULL || src->size != dest->size)
    {
        // reallocate the destination
        inform_dist *redest = inform_dist_realloc(dest, src->size);
        // return NULL if the allocation fails
        if (redest == NULL)
        {
            return NULL;
        }
        // point dest at the new distribution
        dest = redest;
    }
    // don't copy the source to itself
    else if (src == dest)
    {
        return dest;
    }
    // copy the contents of the histogram from the source to the destination
    memcpy(dest->histogram, src->histogram, src->size * sizeof(uint32_t));
    // set the counts appropriately
    dest->counts = src->counts;
    // return the modified destination
    return dest;
}